

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_columnref_expression.cpp
# Opt level: O3

bool __thiscall
duckdb::BoundColumnRefExpression::Equals(BoundColumnRefExpression *this,BaseExpression *other_p)

{
  bool bVar1;
  BoundColumnRefExpression *pBVar2;
  
  bVar1 = BaseExpression::Equals((BaseExpression *)this,other_p);
  if ((bVar1) &&
     (bVar1 = LogicalType::operator==
                        (&(this->super_Expression).return_type,(LogicalType *)(other_p + 1)), bVar1)
     ) {
    pBVar2 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(other_p);
    return this->depth == pBVar2->depth &&
           ((this->binding).column_index == (pBVar2->binding).column_index &&
           (pBVar2->binding).table_index == (this->binding).table_index);
  }
  return false;
}

Assistant:

bool BoundColumnRefExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundColumnRefExpression>();
	return other.binding == binding && other.depth == depth;
}